

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

_Bool Curl_expire_clear(Curl_easy *data)

{
  Curl_multi *pCVar1;
  curl_trc_feat *pcVar2;
  _Bool _Var3;
  uint uVar4;
  
  pCVar1 = data->multi;
  if (pCVar1 != (Curl_multi *)0x0) {
    if (((data->state).expiretime.tv_sec == 0) && ((data->state).expiretime.tv_usec == 0)) {
      _Var3 = false;
    }
    else {
      uVar4 = Curl_splayremove(pCVar1->timetree,&(data->state).timenode,&pCVar1->timetree);
      if ((((data != (Curl_easy *)0x0) && (uVar4 != 0)) && (((data->set).field_0x89f & 0x40) != 0))
         && ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)
             ))) {
        Curl_infof(data,"Internal error clearing splay node = %d",(ulong)uVar4);
      }
      Curl_llist_destroy(&(data->state).timeoutlist,(void *)0x0);
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) && (0 < Curl_trc_feat_multi.log_level)) {
        Curl_trc_multi(data,"Expire cleared");
      }
      (data->state).expiretime.tv_sec = 0;
      (data->state).expiretime.tv_usec = 0;
      _Var3 = true;
    }
    return _Var3;
  }
  return false;
}

Assistant:

bool Curl_expire_clear(struct Curl_easy *data)
{
  struct Curl_multi *multi = data->multi;
  struct curltime *nowp = &data->state.expiretime;

  /* this is only interesting while there is still an associated multi struct
     remaining! */
  if(!multi)
    return FALSE;

  if(nowp->tv_sec || nowp->tv_usec) {
    /* Since this is an cleared time, we must remove the previous entry from
       the splay tree */
    struct Curl_llist *list = &data->state.timeoutlist;
    int rc;

    rc = Curl_splayremove(multi->timetree, &data->state.timenode,
                          &multi->timetree);
    if(rc)
      infof(data, "Internal error clearing splay node = %d", rc);

    /* clear the timeout list too */
    Curl_llist_destroy(list, NULL);

    CURL_TRC_M(data, "Expire cleared");
    nowp->tv_sec = 0;
    nowp->tv_usec = 0;
    return TRUE;
  }
  return FALSE;
}